

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Promise<unsigned_long>_> * __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_long>_>::operator=
          (ArrayBuilder<kj::Promise<unsigned_long>_> *this,
          ArrayBuilder<kj::Promise<unsigned_long>_> *other)

{
  Promise<unsigned_long> *pPVar1;
  RemoveConst<kj::Promise<unsigned_long>_> *pRVar2;
  Promise<unsigned_long> *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Promise<unsigned_long> *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->ptr = (Promise<unsigned_long> *)0x0;
    this->pos = (RemoveConst<kj::Promise<unsigned_long>_> *)0x0;
    this->endPtr = (Promise<unsigned_long> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,8,(long)pRVar2 - (long)pPVar1 >> 3,
               (long)pPVar3 - (long)pPVar1 >> 3,
               ArrayDisposer::Dispose_<kj::Promise<unsigned_long>_>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Promise<unsigned_long> *)0x0;
  other->pos = (RemoveConst<kj::Promise<unsigned_long>_> *)0x0;
  other->endPtr = (Promise<unsigned_long> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }